

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O1

void text_out_e(char *fmt,...)

{
  byte bVar1;
  bool bVar2;
  char in_AL;
  uint8_t uVar3;
  int iVar4;
  byte *pbVar5;
  ushort **ppuVar6;
  char *pcVar7;
  undefined8 in_RCX;
  undefined8 in_RDX;
  byte bVar8;
  byte *buf_00;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  byte *pbVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char tagbuffer [16];
  va_list vp;
  char smallbuf [1024];
  char buf [1024];
  size_t local_940;
  byte *local_938;
  ulong local_930;
  char local_918 [16];
  __va_list_tag local_908;
  undefined1 local_8e8 [8];
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  char local_838 [1024];
  byte local_438 [1032];
  
  local_908.reg_save_area = local_8e8;
  if (in_AL != '\0') {
    local_8b8 = in_XMM0_Qa;
    local_8a8 = in_XMM1_Qa;
    local_898 = in_XMM2_Qa;
    local_888 = in_XMM3_Qa;
    local_878 = in_XMM4_Qa;
    local_868 = in_XMM5_Qa;
    local_858 = in_XMM6_Qa;
    local_848 = in_XMM7_Qa;
  }
  local_908.overflow_arg_area = &stack0x00000008;
  local_908.gp_offset = 8;
  local_908.fp_offset = 0x30;
  buf_00 = local_438;
  local_8e0 = in_RSI;
  local_8d8 = in_RDX;
  local_8d0 = in_RCX;
  local_8c8 = in_R8;
  local_8c0 = in_R9;
  vstrnfmt((char *)buf_00,0x400,fmt,&local_908);
  local_930 = 0;
  do {
    bVar1 = *buf_00;
    pbVar10 = buf_00;
    if (bVar1 == 0) {
      local_938 = (byte *)0x0;
    }
    else {
      pbVar5 = (byte *)strchr((char *)buf_00,0x7b);
      local_938 = (byte *)0x0;
      do {
        if (pbVar5 == (byte *)0x0) {
          local_940 = strlen((char *)pbVar10);
          buf_00 = pbVar10 + local_940;
          break;
        }
        bVar8 = pbVar5[1];
        if (bVar8 != 0) {
          ppuVar6 = __ctype_b_loc();
          pbVar9 = pbVar5 + 2;
          uVar11 = (long)pbVar5 - (long)pbVar10;
          pbVar12 = pbVar9;
          do {
            if ((*(byte *)((long)*ppuVar6 + (ulong)bVar8 * 2 + 1) & 0x24) == 0) {
              if (bVar8 != 0) {
                if (bVar8 != 0x7d) {
                  pbVar5 = (byte *)strchr((char *)(pbVar5 + 1),0x7b);
                  bVar2 = true;
                  goto LAB_001fa144;
                }
                pcVar7 = strstr((char *)(pbVar12 + -1),"{/}");
                if (pcVar7 != (char *)0x0) {
                  local_940 = (long)pbVar5 - (long)pbVar10;
                  if (local_940 == 0) {
                    local_938 = pbVar10 + 1;
                    local_940 = (long)pcVar7 - (long)pbVar9;
                    buf_00 = (byte *)(pcVar7 + 3);
                    bVar2 = false;
                    pbVar10 = pbVar12;
                    local_930 = uVar11;
                  }
                  else {
                    bVar2 = false;
                    buf_00 = pbVar5;
                  }
                  goto LAB_001fa144;
                }
              }
              break;
            }
            bVar8 = *pbVar12;
            pbVar12 = pbVar12 + 1;
            pbVar9 = pbVar9 + 1;
            uVar11 = uVar11 + 1;
          } while (bVar8 != 0);
        }
        local_940 = strlen((char *)pbVar10);
        bVar2 = false;
        buf_00 = pbVar10 + local_940;
LAB_001fa144:
      } while (bVar2);
    }
    if (bVar1 == 0) {
      return;
    }
    memcpy(local_838,pbVar10,local_940);
    local_838[local_940] = '\0';
    if (local_938 == (byte *)0x0) {
      iVar4 = -1;
    }
    else {
      if (0xf < local_930) {
        __assert_fail("taglen < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-textblock.c"
                      ,0x2a6,"void text_out_e(const char *, ...)");
      }
      memcpy(local_918,local_938,local_930);
      local_918[local_930] = '\0';
      iVar4 = color_text_to_attr(local_918);
    }
    uVar3 = (uint8_t)iVar4;
    if (iVar4 == -1) {
      uVar3 = '\x01';
    }
    (*text_out_hook)(uVar3,local_838);
  } while( true );
}

Assistant:

void text_out_e(const char *fmt, ...)
{
	char buf[1024];
	char smallbuf[1024];
	va_list vp;

	const char *start, *next, *text, *tag;
	size_t textlen, taglen = 0;

	/* Begin the Varargs Stuff */
	va_start(vp, fmt);

	/* Do the va_arg fmt to the buffer */
	(void)vstrnfmt(buf, sizeof(buf), fmt, vp);

	/* End the Varargs Stuff */
	va_end(vp);

	start = buf;
	while (next_section(start, 0, &text, &textlen, &tag, &taglen, &next)) {
		int a = -1;

		memcpy(smallbuf, text, textlen);
		smallbuf[textlen] = 0;

		if (tag) {
			char tagbuffer[16];

			/* Colour names are less than 16 characters long. */
			assert(taglen < 16);

			memcpy(tagbuffer, tag, taglen);
			tagbuffer[taglen] = '\0';

			a = color_text_to_attr(tagbuffer);
		}
		
		if (a == -1) 
			a = COLOUR_WHITE;

		/* Output now */
		text_out_hook(a, smallbuf);

		start = next;
	}
}